

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

size_t art_serialize(art_t *art,char *buf)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  ulong uVar8;
  size_t __n;
  long lVar9;
  char *__dest;
  
  if ((buf != (char *)0x0) && (art->first_free[1] == art->capacities[1])) {
    uVar8 = 0;
    do {
      if (uVar8 == 4) goto LAB_00105ae4;
      lVar9 = uVar8 + 2;
      uVar1 = uVar8 + 1;
      lVar7 = uVar8 + 2;
      uVar8 = uVar1;
    } while (art->first_free[lVar9] == art->capacities[lVar7]);
    if (4 < uVar1) {
LAB_00105ae4:
      *(art_ref_t *)buf = art->root;
      uVar2 = art->capacities[1];
      uVar3 = art->capacities[2];
      uVar4 = art->capacities[3];
      uVar5 = art->capacities[4];
      uVar6 = art->capacities[5];
      *(uint64_t *)(buf + 8) = art->capacities[0];
      *(uint64_t *)(buf + 0x10) = uVar2;
      *(uint64_t *)(buf + 0x18) = uVar3;
      *(uint64_t *)(buf + 0x20) = uVar4;
      *(uint64_t *)(buf + 0x28) = uVar5;
      *(uint64_t *)(buf + 0x30) = uVar6;
      __dest = buf + 0x38;
      lVar9 = 0;
      do {
        if (art->capacities[lVar9 + 1] != 0) {
          __n = art->capacities[lVar9 + 1] * ART_NODE_SIZES[lVar9 + 1];
          memcpy(__dest,art->nodes[lVar9 + 1],__n);
          __dest = __dest + __n;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      return (long)__dest - (long)buf;
    }
  }
  return 0;
}

Assistant:

size_t art_serialize(const art_t *art, char *buf) {
    if (buf == NULL) {
        return 0;
    }
    if (!art_is_shrunken(art)) {
        return 0;
    }
    const char *initial_buf = buf;

    // Root.
    memcpy(buf, &art->root, sizeof(art->root));
    buf += sizeof(art->root);

    // Node counts.
    memcpy(buf, art->capacities, sizeof(art->capacities));
    buf += sizeof(art->capacities);

    // Alignment for leaves. The rest of the nodes are aligned the same way.
    size_t align_bytes =
        CROARING_ART_ALIGN_SIZE_RELATIVE(buf, initial_buf, alignof(art_leaf_t));
    memset(buf, 0, align_bytes);
    buf += align_bytes;

    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        if (art->capacities[t] > 0) {
            size_t size = art->capacities[t] * ART_NODE_SIZES[t];
            memcpy(buf, art->nodes[t], size);
            buf += size;
        }
    }

    return buf - initial_buf;
}